

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void * duckdb_je_base_alloc_rtree(tsdn_t *tsdn,base_t *base,size_t size)

{
  void *pvVar1;
  size_t usize;
  
  pvVar1 = base_alloc_impl(tsdn,base,size,0x40,(size_t *)0x0,&usize);
  if (pvVar1 != (void *)0x0) {
    base->rtree_allocated = base->rtree_allocated + usize;
  }
  return pvVar1;
}

Assistant:

void *
base_alloc_rtree(tsdn_t *tsdn, base_t *base, size_t size) {
	size_t usize;
	void *rtree = base_alloc_impl(tsdn, base, size, CACHELINE, NULL,
	    &usize);
	if (rtree == NULL) {
		return NULL;
	}
	if (config_stats) {
		base->rtree_allocated += usize;
	}
	return rtree;
}